

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

void __thiscall Assimp::Exporter::UnregisterExporter(Exporter *this,char *id)

{
  ExporterPimpl *pEVar1;
  bool bVar2;
  int iVar3;
  reference pEVar4;
  const_iterator local_30;
  __normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
  local_28;
  __normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
  local_20;
  iterator it;
  char *id_local;
  Exporter *this_local;
  
  it._M_current = (ExportFormatEntry *)id;
  if (this->pimpl == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x213,"void Assimp::Exporter::UnregisterExporter(const char *)");
  }
  local_20._M_current =
       (ExportFormatEntry *)
       std::
       vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
       ::begin(&this->pimpl->mExporters);
  while( true ) {
    local_28._M_current =
         (ExportFormatEntry *)
         std::
         vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ::end(&this->pimpl->mExporters);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar2) {
      return;
    }
    pEVar4 = __gnu_cxx::
             __normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
             ::operator*(&local_20);
    iVar3 = strcmp((pEVar4->mDescription).id,(char *)it._M_current);
    if (iVar3 == 0) break;
    __gnu_cxx::
    __normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
    ::operator++(&local_20);
  }
  pEVar1 = this->pimpl;
  __gnu_cxx::
  __normal_iterator<Assimp::Exporter::ExportFormatEntry_const*,std::vector<Assimp::Exporter::ExportFormatEntry,std::allocator<Assimp::Exporter::ExportFormatEntry>>>
  ::__normal_iterator<Assimp::Exporter::ExportFormatEntry*>
            ((__normal_iterator<Assimp::Exporter::ExportFormatEntry_const*,std::vector<Assimp::Exporter::ExportFormatEntry,std::allocator<Assimp::Exporter::ExportFormatEntry>>>
              *)&local_30,&local_20);
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::erase(&pEVar1->mExporters,local_30);
  return;
}

Assistant:

void Exporter::UnregisterExporter(const char* id) {
	ai_assert(nullptr != pimpl);
	for (std::vector<ExportFormatEntry>::iterator it = pimpl->mExporters.begin();
            it != pimpl->mExporters.end(); ++it) {
        if (!strcmp((*it).mDescription.id,id)) {
            pimpl->mExporters.erase(it);
            break;
        }
    }
}